

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_enum.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::EnumGenerator::~EnumGenerator(EnumGenerator *this)

{
  SourceGeneratorBase::~SourceGeneratorBase(&this->super_SourceGeneratorBase);
  operator_delete(this,0x18);
  return;
}

Assistant:

void EnumGenerator::Generate(io::Printer* printer) {
  WriteEnumDocComment(printer, options(), descriptor_);
  if (descriptor_->options().deprecated()) {
    printer->Print("[global::System.ObsoleteAttribute]\n");
  }
  printer->Print("$access_level$ enum $name$ {\n",
                 "access_level", class_access_level(),
                 "name", descriptor_->name());
  printer->Indent();
  absl::flat_hash_set<std::string> used_names;
  absl::flat_hash_set<int> used_number;
  for (int i = 0; i < descriptor_->value_count(); i++) {
    WriteEnumValueDocComment(printer, options(), descriptor_->value(i));
    if (descriptor_->value(i)->options().deprecated()) {
      printer->Print("[global::System.ObsoleteAttribute]\n");
    }
    const absl::string_view original_name = descriptor_->value(i)->name();
    std::string name =
        GetEnumValueName(descriptor_->name(), descriptor_->value(i)->name());
    // Make sure we don't get any duplicate names due to prefix removal.
    while (!used_names.insert(name).second) {
      // It's possible we'll end up giving this warning multiple times, but
      // that's better than not at all.
      ABSL_LOG(WARNING) << "Duplicate enum value " << name << " (originally "
                        << original_name << ") in " << descriptor_->name()
                        << "; adding underscore to distinguish";
      absl::StrAppend(&name, "_");
    }
    int number = descriptor_->value(i)->number();
    if (!used_number.insert(number).second) {
      printer->Print(
          "[pbr::OriginalName(\"$original_name$\", PreferredAlias = false)] "
          "$name$ = $number$,\n",
          "original_name", original_name, "name", name, "number",
          absl::StrCat(number));
    } else {
      printer->Print(
          "[pbr::OriginalName(\"$original_name$\")] $name$ = $number$,\n",
          "original_name", original_name, "name", name, "number",
          absl::StrCat(number));
    }
  }
  printer->Outdent();
  printer->Print("}\n");
  printer->Print("\n");
}